

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message.c++
# Opt level: O0

ArrayPtr<capnp::word> __thiscall
capnp::FlatMessageBuilder::allocateSegment(FlatMessageBuilder *this,uint minimumSize)

{
  bool bVar1;
  Fault local_30;
  Fault f;
  DebugExpression<bool> _kjCondition;
  uint minimumSize_local;
  FlatMessageBuilder *this_local;
  
  f.exception._2_1_ = (this->allocated ^ 0xffU) & 1;
  f.exception._4_4_ = minimumSize;
  f.exception._3_1_ =
       kj::_::DebugExpressionStart::operator<<
                 ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,(bool *)((long)&f.exception + 2));
  bVar1 = kj::_::DebugExpression::operator_cast_to_bool((DebugExpression *)((long)&f.exception + 3))
  ;
  if (!bVar1) {
    kj::_::Debug::Fault::Fault<kj::Exception::Type,kj::_::DebugExpression<bool>&,char_const(&)[50]>
              (&local_30,
               "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/message.c++"
               ,0x12f,FAILED,"!allocated",
               "_kjCondition,\"FlatMessageBuilder\'s buffer was not large enough.\"",
               (DebugExpression<bool> *)((long)&f.exception + 3),
               (char (*) [50])"FlatMessageBuilder\'s buffer was not large enough.");
    kj::_::Debug::Fault::fatal(&local_30);
  }
  this->allocated = true;
  return this->array;
}

Assistant:

kj::ArrayPtr<word> FlatMessageBuilder::allocateSegment(uint minimumSize) {
  KJ_REQUIRE(!allocated, "FlatMessageBuilder's buffer was not large enough.");
  allocated = true;
  return array;
}